

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void baryonyx::itm::
     init_with_bastert<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>
               (bit_array *x,default_cost_type<float> *c,int variables,int value_if_0)

{
  float fVar1;
  ulong uVar2;
  
  for (uVar2 = 0; (uint)variables != uVar2; uVar2 = uVar2 + 1) {
    fVar1 = (c->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
            _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
            super__Head_base<0UL,_float_*,_false>._M_head_impl[uVar2];
    if ((fVar1 < 0.0) || (value_if_0 != 0 && fVar1 == 0.0)) {
      bit_array_impl::set(&x->super_bit_array_impl,(int)uVar2);
    }
    else {
      bit_array_impl::unset(&x->super_bit_array_impl,(int)uVar2);
    }
  }
  return;
}

Assistant:

void
init_with_bastert(bit_array& x,
                  const Cost& c,
                  const int variables,
                  const int value_if_0) noexcept
{
    for (int i = 0; i != variables; ++i)
        if (init_x<Mode>(c[i], value_if_0))
            x.set(i);
        else
            x.unset(i);
}